

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall bsplib::Rdma::PushPopCommBuf::execute(PushPopCommBuf *this,Rdma *rdma)

{
  list<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  pointer pPVar5;
  pointer pPVar6;
  Memslot MVar7;
  pointer puVar8;
  pointer pMVar9;
  void *pvVar10;
  _Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  __it;
  _List_node_base *p_Var11;
  exception *peVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  const_iterator __position;
  ulong uVar16;
  Memslot *pMVar17;
  uint *puVar18;
  long lVar19;
  Memslot id;
  void *addr;
  _List_node_base *local_1f8;
  _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1e8;
  PushPopCommBuf *local_1e0;
  void *local_1d8;
  exception local_1d0;
  
  iVar3 = rdma->m_pid;
  uVar4 = rdma->m_nprocs;
  uVar15 = (ulong)(int)uVar4;
  pPVar5 = (this->m_pushed_slots).
           super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar6 = (this->m_pushed_slots).
           super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar16 = 0;
  uVar14 = 0;
  if (0 < (int)uVar4) {
    uVar14 = (ulong)uVar4;
  }
  pMVar17 = &pPVar5->slot;
  for (; local_1e0 = this, uVar16 < (ulong)((long)pPVar6 - (long)pPVar5 >> 5) / uVar15;
      uVar16 = uVar16 + 1) {
    MVar7 = pPVar5[uVar16 * uVar15].slot;
    puVar18 = (uint *)((long)&((rdma->m_used_slots).
                               super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                               ._M_impl.super__Vector_impl_data._M_start)->status +
                      uVar15 * 0x18 * MVar7);
    for (lVar19 = 0; uVar14 << 5 != lVar19; lVar19 = lVar19 + 0x20) {
      if (*(Memslot *)((long)pMVar17 + lVar19) != MVar7) {
        peVar12 = (exception *)__cxa_allocate_exception(0x1a0);
        exception::exception(&local_1d0,"bsp_push_reg");
        std::operator<<((ostream *)&local_1d0.m_stream,"Internal error; inconsistent slot id");
        exception::exception(peVar12,&local_1d0);
        __cxa_throw(peVar12,&exception::typeinfo,exception::~exception);
      }
      ((Memblock *)(puVar18 + 0xfffffffffffffffc))->addr =
           (void *)*(undefined8 *)((long)pMVar17 + lVar19 + -0x18);
      *(size_t *)(puVar18 + 0xfffffffffffffffe) = *(size_t *)((long)pMVar17 + lVar19 + -0x10);
      *(byte *)puVar18 = (byte)*puVar18 & 0xfe;
      puVar18 = puVar18 + 6;
    }
    pMVar17 = pMVar17 + uVar15 * 4;
  }
  local_1f0 = &(rdma->m_register)._M_h;
  local_1e8 = &rdma->m_free_slots;
  uVar15 = 0;
  while( true ) {
    puVar8 = (local_1e0->m_popped_slots).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_1e0->m_popped_slots).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar8 >> 3) <= uVar15) {
      return;
    }
    local_1f8 = (_List_node_base *)puVar8[uVar15];
    if (local_1f8 == (_List_node_base *)0xffffffffffffffff) break;
    lVar19 = (long)local_1f8 * (long)rdma->m_nprocs;
    pMVar9 = (rdma->m_used_slots).
             super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar10 = pMVar9[lVar19 + iVar3].addr;
    if ((pvVar10 != (void *)0x0) && ((pMVar9[lVar19 + iVar3].status & 2) == 0)) {
      __assert_fail("rdma.slot(pid,id).addr == NULL || rdma.slot( pid, id ).status & Memblock::POPPED"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                    ,0x1fe,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
    }
    local_1d8 = pvVar10;
    __it._M_cur = (__node_type *)
                  std::
                  _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(local_1f0,&local_1d8);
    if (__it._M_cur == (__node_type *)0x0) {
      __assert_fail("reg_entry != rdma.m_register.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                    ,0x201,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
    }
    lVar19 = (long)__it._M_cur + 0x10;
    do {
      lVar13 = lVar19;
      if (lVar13 == *(long *)((long)__it._M_cur + 0x10)) {
        peVar12 = (exception *)__cxa_allocate_exception(0x1a0);
        exception::exception(&local_1d0,"bsp_pop_reg");
        std::operator<<((ostream *)&local_1d0.m_stream,"Internal error: inconsistent slot id");
        exception::exception(peVar12,&local_1d0);
        __cxa_throw(peVar12,&exception::typeinfo,exception::~exception);
      }
      lVar19 = *(long *)(lVar13 + 8);
    } while (*(_List_node_base **)(*(long *)(lVar13 + 8) + 0x10) != local_1f8);
    __position._M_node = *(_List_node_base **)(lVar13 + 8);
LAB_0010e3d9:
    if (__position._M_node[1]._M_next != local_1f8) {
      __assert_fail("*rs == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                    ,0x22d,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
    }
    this_00 = (list<unsigned_long,_std::allocator<unsigned_long>_> *)
              ((long)&((__it._M_cur)->
                      super__Hash_node_value<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_storage._M_storage + 8);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::erase(this_00,__position);
    if (*(list<unsigned_long,_std::allocator<unsigned_long>_> **)
         ((long)&((__it._M_cur)->
                 super__Hash_node_value<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_storage._M_storage + 8) == this_00) {
      std::
      _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(local_1f0,(const_iterator)__it._M_cur);
    }
    lVar19 = (long)rdma->m_nprocs * (long)local_1f8;
    pMVar9 = (rdma->m_used_slots).
             super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (lVar13 = 0; uVar14 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
      puVar2 = (undefined8 *)((long)&pMVar9[lVar19].addr + lVar13);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined4 *)((long)&pMVar9[lVar19].status + lVar13) = 0;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (local_1e8,(value_type_conflict *)&local_1f8);
    uVar15 = uVar15 + 1;
  }
  local_1d0.super_exception = (exception)0x0;
  local_1d0._1_7_ = 0;
  __it._M_cur = (__node_type *)
                std::
                _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_1f0,(key_type *)&local_1d0);
  if (__it._M_cur == (__node_type *)0x0) {
    peVar12 = (exception *)__cxa_allocate_exception(0x1a0);
    exception::exception(&local_1d0,"bsp_pop_reg");
    std::operator<<((ostream *)&local_1d0.m_stream,
                    "Tried to deregister NULL on all processes, but NULL was never registered");
    exception::exception(peVar12,&local_1d0);
    __cxa_throw(peVar12,&exception::typeinfo,exception::~exception);
  }
  p_Var11 = (_List_node_base *)((long)__it._M_cur + 0x10);
  __position._M_node = p_Var11;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == p_Var11) {
LAB_0010e520:
      peVar12 = (exception *)__cxa_allocate_exception(0x1a0);
      exception::exception(&local_1d0,"bsp_pop_reg");
      std::operator<<((ostream *)&local_1d0.m_stream,
                      "Tried to deregister NULL on all processes, but could not find a matching regisration (bsp_push_reg)"
                     );
      exception::exception(peVar12,&local_1d0);
      __cxa_throw(peVar12,&exception::typeinfo,exception::~exception);
    }
    local_1f8 = __position._M_node[1]._M_next;
    lVar19 = 0;
    do {
      if (uVar14 * 0x18 + 0x18 == lVar19 + 0x18) {
        if (__position._M_node != p_Var11) goto LAB_0010e3d9;
        goto LAB_0010e520;
      }
      plVar1 = (long *)((long)&(rdma->m_used_slots).
                               super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(long)local_1f8 * (long)rdma->m_nprocs].addr + lVar19);
      lVar19 = lVar19 + 0x18;
    } while (*plVar1 == 0);
  } while( true );
}

Assistant:

void Rdma::PushPopCommBuf::execute( Rdma & rdma ) 
{
    const int pid = rdma.m_pid;
    const int nprocs = rdma.m_nprocs;
 
    /* do memory registrations */
    for (size_t s = 0; s < m_pushed_slots.size()/nprocs; ++s) {
        Memslot id = m_pushed_slots[s*nprocs].slot;

        for ( int p = 0 ; p < nprocs; ++p ) {
            if ( m_pushed_slots[ s*nprocs + p ].slot != id )
                throw exception("bsp_push_reg") << "Internal error; inconsistent slot id";

            rdma.slot( p, id ).addr = m_pushed_slots[ s*nprocs + p ].block.addr;
            rdma.slot( p, id ).size = m_pushed_slots[ s*nprocs + p ].block.size;
            rdma.slot( p, id ).status &= ~Memblock::PUSHED; 
        }
    }

    /* do memory deregistrations */
    for (size_t s = 0; s < m_popped_slots.size(); ++s) {
        Memslot id = m_popped_slots[s];

        Reg::iterator reg_entry;
        RegStack :: iterator rs; 

        if ( id != no_slot() ) {
            assert( rdma.slot(pid,id).addr == NULL
                   || rdma.slot( pid, id ).status & Memblock::POPPED );
            void * addr = rdma.slot( pid, id).addr;
            reg_entry = rdma.m_register.find( addr );
            assert( reg_entry != rdma.m_register.end() );
            RegStack & stack = reg_entry->second;
            RegStack :: reverse_iterator j ; 
            for (j = stack.rbegin(); j != stack.rend(); ++j )
                if ( *j == id ) break;

            if ( j == stack.rend() )
                throw exception("bsp_pop_reg") << "Internal error: inconsistent slot id";

            rs = j.base();
            --rs;
        }
        else
        { // then all processes have popped NULL
          // Let's delete the first full block of NULL we can encounter

            reg_entry = rdma.m_register.find( NULL );
            if( reg_entry == rdma.m_register.end() )
                throw exception("bsp_pop_reg") <<
                    "Tried to deregister NULL on all processes, but NULL was never registered";

            RegStack & stack = reg_entry->second;

            for ( rs = stack.begin(); rs != stack.end(); ++rs ) {

                id = *rs;

                bool all_nulls = true;
                for ( int p = 0; p < nprocs; ++p ) {
                    if ( rdma.slot( p, id ).addr != NULL ) {
                        all_nulls = false;
                        break;
                    }
                }

                if ( all_nulls ) {
                   break;
                }
            }
            if ( rs == stack.end() ) 
                throw exception("bsp_pop_reg") <<
                    "Tried to deregister NULL on all processes, but could not find a matching regisration (bsp_push_reg)";
        }

        assert( *rs == id );
        reg_entry->second.erase( rs );

        if ( reg_entry->second.empty())
            rdma.m_register.erase( reg_entry );

        for (int p = 0; p < nprocs; ++p) {
            rdma.slot( p, id ).addr = NULL;
            rdma.slot( p, id ).size = 0;
            rdma.slot( p, id ).status = Memblock::NORMAL;
        }
        rdma.m_free_slots.push_back( id );
    }
}